

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::UdpOutputPortDeclSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,UdpOutputPortDeclSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (UdpOutputPortDeclSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (UdpOutputPortDeclSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 5;
    break;
  case (UdpOutputPortDeclSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (UdpOutputPortDeclSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (UdpOutputPortDeclSyntax *)0x4:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[8].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax UdpOutputPortDeclSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &keyword;
        case 2: return &reg;
        case 3: return &name;
        case 4: return initializer;
        default: return nullptr;
    }
}